

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

String * __thiscall
Jinx::Impl::Parser::CheckLibraryName_abi_cxx11_(String *__return_storage_ptr__,Parser *this)

{
  SymbolType symbol;
  Symbol *pSVar1;
  pointer pcVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  pointer __str;
  String tokenName;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  symbol = ((this->m_currentSymbol)._M_current)->type;
  if ((symbol == NameValue) || (bVar4 = IsKeyword(symbol), bVar4)) {
    pSVar1 = (this->m_currentSymbol)._M_current;
    pcVar2 = (pSVar1->text)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
    _M_construct<char*>((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)&local_50
                        ,pcVar2,pcVar2 + (pSVar1->text)._M_string_length);
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            compare(&local_50,
                    &((this->m_library).
                      super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     m_name);
    if (iVar5 == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_assign
                (__return_storage_ptr__,
                 &((this->m_library).
                   super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  m_name);
    }
    else {
      __str = (this->m_importList).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
              ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (this->m_importList).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__str != pbVar3) {
        do {
          iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                  compare(&local_50,__str);
          if (iVar5 == 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            _M_assign(__return_storage_ptr__,__str);
            break;
          }
          __str = __str + 1;
        } while (__str != pbVar3);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      MemFree(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t String Parser::CheckLibraryName() const
	{
		String libraryName;
		if (m_currentSymbol->type == SymbolType::NameValue || IsKeyword(m_currentSymbol->type))
		{
			auto tokenName = m_currentSymbol->text;
			if (tokenName == m_library->GetName())
			{
				libraryName = m_library->GetName();
			}
			else
			{
				for (auto & importName : m_importList)
				{
					if (tokenName == importName)
					{
						libraryName = importName;
						break;
					}
				}
			}
		}
		return libraryName;
	}